

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall FlowGraph::SortLoopLists(FlowGraph *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  BasicBlock *this_00;
  Type *ppBVar4;
  BasicBlock **insertBlock;
  EditingIterator newIter;
  BasicBlock **block;
  EditingIterator iter;
  Loop *pLStack_18;
  uint lastBlockNumber;
  Loop *loop;
  FlowGraph *this_local;
  
  pLStack_18 = this->loopList;
  do {
    if (pLStack_18 == (Loop *)0x0) {
      return;
    }
    this_00 = Loop::GetHeadBlock(pLStack_18);
    iter.super_EditingIterator.last._4_4_ = BasicBlock::GetBlockNum(this_00);
    SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&block,&pLStack_18->blockList);
    while (bVar1 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                             ((EditingIterator *)&block), bVar1) {
      newIter.super_EditingIterator.last =
           (NodeBase *)
           SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                     ((Iterator *)&block);
      uVar3 = iter.super_EditingIterator.last._4_4_;
      if ((*(ushort *)&((Type)(newIter.super_EditingIterator.last)->next)->field_0x18 & 1) == 0) {
        uVar2 = BasicBlock::GetBlockNum((BasicBlock *)(newIter.super_EditingIterator.last)->next);
        if (uVar2 < uVar3) {
          SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrent
                    ((EditingIterator *)&block);
          SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
                    ((EditingIterator *)&insertBlock,&pLStack_18->blockList);
          do {
            do {
              bVar1 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
                      Next((EditingIterator *)&insertBlock);
              if (!bVar1) goto LAB_0052fbfe;
              ppBVar4 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                  ((Iterator *)&insertBlock);
            } while ((*(ushort *)&(*ppBVar4)->field_0x18 & 1) != 0);
            uVar3 = BasicBlock::GetBlockNum(*ppBVar4);
            uVar2 = BasicBlock::GetBlockNum
                              ((BasicBlock *)(newIter.super_EditingIterator.last)->next);
          } while (uVar3 <= uVar2);
LAB_0052fbfe:
          SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
                    ((EditingIterator *)&insertBlock,
                     (BasicBlock **)newIter.super_EditingIterator.last);
        }
        else {
          iter.super_EditingIterator.last._4_4_ =
               BasicBlock::GetBlockNum((BasicBlock *)(newIter.super_EditingIterator.last)->next);
        }
      }
    }
    pLStack_18 = pLStack_18->next;
  } while( true );
}

Assistant:

void
FlowGraph::SortLoopLists()
{
    // Sort the blocks in loopList
    for (Loop *loop = this->loopList; loop; loop = loop->next)
    {
        unsigned int lastBlockNumber = loop->GetHeadBlock()->GetBlockNum();
        // Insertion sort as the blockList is almost sorted in the loop.
        FOREACH_BLOCK_IN_LOOP_EDITING(block, loop, iter)
        {
            if (lastBlockNumber <= block->GetBlockNum())
            {
                lastBlockNumber = block->GetBlockNum();
            }
            else
            {
                iter.UnlinkCurrent();
                FOREACH_BLOCK_IN_LOOP_EDITING(insertBlock,loop,newIter)
                {
                    if (insertBlock->GetBlockNum() > block->GetBlockNum())
                    {
                        break;
                    }
                }NEXT_BLOCK_IN_LOOP_EDITING;
                newIter.InsertBefore(block);
            }
        }NEXT_BLOCK_IN_LOOP_EDITING;
    }
}